

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_len.c
# Opt level: O3

uint str_len(char *s)

{
  char *pcVar1;
  int iVar2;
  char *t;
  
  iVar2 = (int)s;
  if (*s != '\0') {
    pcVar1 = s + 2;
    do {
      s = pcVar1;
      if (s[-1] == '\0') {
        s = s + -1;
        goto LAB_001027b7;
      }
      if (*s == '\0') goto LAB_001027b7;
      if (s[1] == '\0') {
        s = s + 1;
        goto LAB_001027b7;
      }
      pcVar1 = s + 4;
    } while (s[2] != '\0');
    s = s + 2;
  }
LAB_001027b7:
  return (int)s - iVar2;
}

Assistant:

unsigned int str_len(const char *s)
{
  register const char *t;

  t = s;
  for (;;) {
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
  }
}